

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O0

void __thiscall
tchecker::clock_updates_map_t::clock_updates_map_t(clock_updates_map_t *this,size_t clock_nb)

{
  uint clock_id;
  reference this_00;
  shared_ptr<tchecker::int_expression_t> local_68;
  shared_ptr<const_tchecker::expression_t> local_58;
  clock_update_t local_48;
  uint local_30;
  clock_id_t x;
  allocator<tchecker::clock_updates_list_t> local_19;
  size_t local_18;
  size_t clock_nb_local;
  clock_updates_map_t *this_local;
  
  local_18 = clock_nb;
  clock_nb_local = (size_t)this;
  std::allocator<tchecker::clock_updates_list_t>::allocator(&local_19);
  std::vector<tchecker::clock_updates_list_t,_std::allocator<tchecker::clock_updates_list_t>_>::
  vector(&this->_map,clock_nb,&local_19);
  std::allocator<tchecker::clock_updates_list_t>::~allocator(&local_19);
  for (local_30 = 0; local_30 < local_18; local_30 = local_30 + 1) {
    this_00 = std::
              vector<tchecker::clock_updates_list_t,_std::allocator<tchecker::clock_updates_list_t>_>
              ::operator[](&this->_map,(ulong)local_30);
    clock_id = local_30;
    std::make_shared<tchecker::int_expression_t,int>((int *)&local_68);
    std::shared_ptr<tchecker::expression_t_const>::shared_ptr<tchecker::int_expression_t,void>
              ((shared_ptr<tchecker::expression_t_const> *)&local_58,&local_68);
    clock_update_t::clock_update_t(&local_48,clock_id,&local_58);
    clock_updates_list_t::set(this_00,&local_48);
    clock_update_t::~clock_update_t(&local_48);
    std::shared_ptr<const_tchecker::expression_t>::~shared_ptr(&local_58);
    std::shared_ptr<tchecker::int_expression_t>::~shared_ptr(&local_68);
  }
  return;
}

Assistant:

clock_updates_map_t::clock_updates_map_t(std::size_t clock_nb) : _map(clock_nb)
{
  for (tchecker::clock_id_t x = 0; x < clock_nb; ++x)
    _map[x].set(tchecker::clock_update_t{x, std::make_shared<tchecker::int_expression_t>(0)});
}